

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void firstStage(vector<Crawler_*,_std::allocator<Crawler_*>_> *crawlers,Logger *logger)

{
  reference ppCVar1;
  ostream *poVar2;
  string local_e0;
  uint local_bc;
  uint local_b8;
  uint i_3;
  uint i_2;
  uint j_3;
  uint local_94;
  undefined1 local_90 [4];
  uint j_2;
  uint local_70;
  uint local_6c;
  uint j_1;
  uint j;
  uint local_3c;
  undefined1 local_38 [4];
  uint i_1;
  list<bdNodeId,_std::allocator<bdNodeId>_> tempIDStorage;
  uint i;
  Logger *logger_local;
  vector<Crawler_*,_std::allocator<Crawler_*>_> *crawlers_local;
  
  for (tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node._M_size.
       _4_4_ = 0;
      tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node._M_size.
      _4_4_ < 0x100;
      tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node._M_size.
      _4_4_ = tempIDStorage.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node.
              _M_size._4_4_ + 1) {
    ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                        (crawlers,(ulong)tempIDStorage.
                                         super__List_base<bdNodeId,_std::allocator<bdNodeId>_>.
                                         _M_impl._M_node._M_size._4_4_);
    Crawler::startDht(*ppCVar1);
  }
  Logger::enable(logger,true);
  std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::list
            ((list<bdNodeId,_std::allocator<bdNodeId>_> *)local_38);
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    sleep(0xf);
    Logger::getDiscoveredPeers_abi_cxx11_();
    std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
              ((list<bdNodeId,_std::allocator<bdNodeId>_> *)local_38,
               (list<bdNodeId,_std::allocator<bdNodeId>_> *)&j_1);
    std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::~list
              ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&j_1);
    for (local_6c = 0; local_6c < 0x100; local_6c = local_6c + 1) {
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                          (crawlers,(ulong)local_6c);
      Crawler::enable(*ppCVar1,false);
    }
    for (local_70 = 0; local_70 < 0x100; local_70 = local_70 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Waiting for crawler ");
      std::__cxx11::to_string((string *)local_90,local_70);
      poVar2 = std::operator<<(poVar2,(string *)local_90);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_90);
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                          (crawlers,(ulong)local_70);
      Crawler::enableDht(*ppCVar1,false);
    }
    for (local_94 = 0; local_94 < 0x100; local_94 = local_94 + 1) {
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                          (crawlers,(ulong)local_94);
      Crawler::getToCheckList_abi_cxx11_((list<bdNodeId,_std::allocator<bdNodeId>_> *)&i_2,*ppCVar1)
      ;
      std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
                ((list<bdNodeId,_std::allocator<bdNodeId>_> *)local_38,
                 (list<bdNodeId,_std::allocator<bdNodeId>_> *)&i_2);
      std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::~list
                ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&i_2);
    }
    for (i_3 = 0; i_3 < 0x100; i_3 = i_3 + 1) {
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[](crawlers,(ulong)i_3);
      Crawler::extractToCheckList(*ppCVar1,(list<bdNodeId,_std::allocator<bdNodeId>_> *)local_38);
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[](crawlers,(ulong)i_3);
      Crawler::enableDht(*ppCVar1,true);
      ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[](crawlers,(ulong)i_3);
      Crawler::enable(*ppCVar1,true);
    }
  }
  for (local_b8 = 0; local_b8 < 0x100; local_b8 = local_b8 + 1) {
    ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                        (crawlers,(ulong)local_b8);
    Crawler::enable(*ppCVar1,false);
  }
  for (local_bc = 0; local_bc < 0x100; local_bc = local_bc + 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Waiting for crawler ");
    std::__cxx11::to_string(&local_e0,local_bc);
    poVar2 = std::operator<<(poVar2,(string *)&local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e0);
    ppCVar1 = std::vector<Crawler_*,_std::allocator<Crawler_*>_>::operator[]
                        (crawlers,(ulong)local_bc);
    Crawler::enableDht(*ppCVar1,false);
  }
  Logger::enable(logger,false);
  std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::~list
            ((list<bdNodeId,_std::allocator<bdNodeId>_> *)local_38);
  return;
}

Assistant:

void firstStage(std::vector<Crawler*>& crawlers, Logger& logger) {
    // Launch crawlers and logger
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->startDht();
    logger.enable(true);

    std::list<bdNodeId> tempIDStorage;
    for (unsigned int i = 0; i < CRAWLS_COUNT; i++) {
        // Waiting for crawlers duty
        sleep(CRAWL_DURATION);
        // Get the previously found peers
        tempIDStorage.merge(Logger::getDiscoveredPeers());
        // Sorting out of region IDs
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            crawlers[j]->enable(false);
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            std::cerr << "Waiting for crawler " << std::to_string(j) << std::endl;
            crawlers[j]->enableDht(false);
        }
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            // Get the found nodes lists
            tempIDStorage.merge(crawlers[j]->getToCheckList());
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            // Restart nodes, not to hold the handler for too long
//            crawlers[j]->restart();
            // Inject new peers to check and activate crawlers
            crawlers[j]->extractToCheckList(tempIDStorage);
            crawlers[j]->enableDht(true);
            crawlers[j]->enable(true);
        }
    }
    // Pause crawling and logging
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->enable(false);
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++) {
        std::cerr << "Waiting for crawler " << std::to_string(i) << std::endl;
        crawlers[i]->enableDht(false);
    }
    logger.enable(false);
}